

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,labelled_statement *s)

{
  bool bVar1;
  wstring *pwVar2;
  wostream *pwVar3;
  native_error_exception *this_00;
  statement *psVar4;
  value_type local_240;
  undefined1 local_229;
  wstring local_228 [32];
  wstring_view local_208;
  wstring local_1f8;
  wstring_view local_1d8 [2];
  wostringstream local_1b8 [8];
  wostringstream woss;
  __normal_iterator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_*,_std::vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>_>
  local_40;
  __normal_iterator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_*,_std::vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>_>
  local_38;
  __normal_iterator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_*,_std::vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>_>
  local_30;
  __normal_iterator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_*,_std::vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>_>
  local_28;
  labelled_statement *local_20;
  labelled_statement *s_local;
  impl *this_local;
  
  local_20 = s;
  s_local = (labelled_statement *)this;
  this_local = (impl *)__return_storage_ptr__;
  if ((labelled_statement *)this->labels_valid_for_ != s) {
    std::
    vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::clear(&this->label_set_);
  }
  local_30._M_current =
       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
       std::
       vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
       ::begin(&this->label_set_);
  local_38._M_current =
       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
       std::
       vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
       ::end(&this->label_set_);
  pwVar2 = labelled_statement::id_abi_cxx11_(local_20);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>*,std::vector<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>>,std::__cxx11::wstring>
                       (local_30,local_38,pwVar2);
  local_40._M_current =
       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
       std::
       vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
       ::end(&this->label_set_);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_40);
  if (!bVar1) {
    pwVar2 = labelled_statement::id_abi_cxx11_(local_20);
    local_240 = (value_type)
                std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pwVar2);
    std::
    vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::push_back(&this->label_set_,&local_240);
    psVar4 = labelled_statement::s(local_20);
    this->labels_valid_for_ = psVar4;
    psVar4 = labelled_statement::s(local_20);
    eval(__return_storage_ptr__,this,psVar4);
    return __return_storage_ptr__;
  }
  std::__cxx11::wostringstream::wostringstream(local_1b8);
  pwVar3 = std::operator<<((wostream *)local_1b8,"Duplicate label ");
  pwVar2 = labelled_statement::id_abi_cxx11_(local_20);
  std::operator<<(pwVar3,(wstring *)pwVar2);
  local_229 = 1;
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1f8,this);
  local_1d8[0] = (wstring_view)
                 std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_1f8);
  std::__cxx11::wostringstream::str();
  local_208 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_228);
  native_error_exception::native_error_exception(this_00,syntax,local_1d8,&local_208);
  local_229 = 0;
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

completion operator()(const labelled_statement& s) {
        if (labels_valid_for_ != &s) {
            label_set_.clear();
        }
        if (std::find(label_set_.begin(), label_set_.end(), s.id()) != label_set_.end()) {
            std::wostringstream woss;
            woss << "Duplicate label " << s.id();
            throw native_error_exception(native_error_type::syntax, stack_trace(), woss.str());
        }
        label_set_.push_back(s.id());
        labels_valid_for_ = &s.s();
        return eval(s.s());
    }